

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

void mpack_tree_parse(mpack_tree_t *tree)

{
  _Bool _Var1;
  mpack_error_t mVar2;
  undefined8 local_d8;
  mpack_level_t stack_local [8];
  undefined1 local_50 [8];
  mpack_tree_parser_t parser;
  mpack_tree_t *tree_local;
  
  parser._56_8_ = tree;
  mVar2 = mpack_tree_error(tree);
  if (mVar2 == mpack_ok) {
    *(undefined1 *)(parser._56_8_ + 0x80) = 1;
    mpack_tree_cleanup((mpack_tree_t *)parser._56_8_);
    if (*(long *)(parser._56_8_ + 0x60) != 0) {
      if (*(long *)(parser._56_8_ + 0x38) == 0) {
        *(long *)(parser._56_8_ + 0x48) =
             *(long *)(parser._56_8_ + 0x60) + *(long *)(parser._56_8_ + 0x48);
      }
      else {
        memmove(*(void **)(parser._56_8_ + 0x38),
                (void *)(*(long *)(parser._56_8_ + 0x38) + *(long *)(parser._56_8_ + 0x60)),
                *(long *)(parser._56_8_ + 0x50) - *(long *)(parser._56_8_ + 0x60));
      }
      *(long *)(parser._56_8_ + 0x50) =
           *(long *)(parser._56_8_ + 0x50) - *(long *)(parser._56_8_ + 0x60);
      *(undefined8 *)(parser._56_8_ + 0x60) = 0;
    }
    mpack_tree_parser_setup((mpack_tree_parser_t *)local_50,(mpack_tree_t *)parser._56_8_);
    mVar2 = mpack_tree_error((mpack_tree_t *)parser._56_8_);
    if ((mVar2 == mpack_ok) &&
       (_Var1 = mpack_tree_reserve_bytes((mpack_tree_parser_t *)local_50,1), _Var1)) {
      *(size_t *)(parser._56_8_ + 0x78) = parser.possible_nodes_left;
      parser.possible_nodes_left = parser.possible_nodes_left + 0x10;
      parser.nodes = (mpack_node_data_t *)((long)&parser.nodes[-1].value + 7);
      *(undefined8 *)(parser._56_8_ + 0x58) = 1;
      parser.stack._0_1_ = 0;
      parser.level = 8;
      parser.depth = (size_t)&local_d8;
      parser.nodes_left = 0;
      local_d8 = *(undefined8 *)(parser._56_8_ + 0x78);
      stack_local[0].child = (mpack_node_data_t *)0x1;
      mpack_tree_parse_elements((mpack_tree_parser_t *)local_50);
      if (((byte)parser.stack & 1) != 0) {
        free((void *)parser.depth);
      }
      mpack_tree_error((mpack_tree_t *)parser._56_8_);
    }
  }
  return;
}

Assistant:

void mpack_tree_parse(mpack_tree_t* tree) {
    if (mpack_tree_error(tree) != mpack_ok)
        return;
    tree->parsed = true;

    mpack_tree_cleanup(tree);

    mpack_log("starting parse\n");

    // check if we previously parsed a tree
    if (tree->size > 0) {
        #ifdef MPACK_MALLOC
        // if we're buffered, move the remaining data back to the
        // start of the buffer
        // TODO: shrink buffer?
        if (tree->buffer != NULL) {
            mpack_memmove(tree->buffer, tree->buffer + tree->size, tree->data_length - tree->size);
        }
        else
        #endif
        // otherwise advance past the parsed data
        {
            tree->data += tree->size;
        }
        tree->data_length -= tree->size;
        tree->size = 0;
    }

    // setup parser
    mpack_tree_parser_t parser;
    mpack_tree_parser_setup(&parser, tree);
    if (mpack_tree_error(tree) != mpack_ok)
        return;

    // allocate the root node
    if (!mpack_tree_reserve_bytes(&parser, sizeof(uint8_t)))
        return;
    tree->root = parser.nodes;
    ++parser.nodes;
    --parser.nodes_left;
    tree->node_count = 1;

    // We read nodes in a loop instead of recursively for maximum
    // performance. The stack holds the amount of children left to
    // read in each level of the tree.

    // Even when we have a malloc() function, it's much faster to
    // allocate the initial parsing stack on the call stack. We
    // replace it with a heap allocation if we need to grow it.
    #ifdef MPACK_MALLOC
    #define MPACK_NODE_STACK_LOCAL_DEPTH MPACK_NODE_INITIAL_DEPTH
    parser.stack_owned = false;
    #else
    #define MPACK_NODE_STACK_LOCAL_DEPTH MPACK_NODE_MAX_DEPTH_WITHOUT_MALLOC
    #endif
    mpack_level_t stack_local[MPACK_NODE_STACK_LOCAL_DEPTH]; // no VLAs in VS 2013
    parser.depth = MPACK_NODE_STACK_LOCAL_DEPTH;
    parser.stack = stack_local;
    #undef MPACK_NODE_STACK_LOCAL_DEPTH
    parser.level = 0;
    parser.stack[0].child = tree->root;
    parser.stack[0].left = 1;

    mpack_tree_parse_elements(&parser);

    #ifdef MPACK_MALLOC
    if (parser.stack_owned)
        MPACK_FREE(parser.stack);
    #endif

    if (mpack_tree_error(tree) == mpack_ok) {
        mpack_log("parsed tree of %i bytes, %i bytes left\n", (int)tree->size, (int)parser.possible_nodes_left);
        mpack_log("%i nodes in final page\n", (int)parser.nodes_left);
    }
}